

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

Data * __thiscall QTzTimeZonePrivate::data(QTzTimeZonePrivate *this,TimeType timeType)

{
  QTzTransitionTime tran_00;
  anon_class_8_1_770d7854 __pred;
  bool bVar1;
  undefined1 uVar2;
  QTzTimeZonePrivate *pQVar3;
  QTzTransitionTime *pQVar4;
  QList<QTzTransitionTime> *pQVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  int in_EDX;
  QTzTimeZonePrivate *in_RSI;
  Data *in_RDI;
  long in_FS_OFFSET;
  qint64 currentMSecs;
  const_iterator it;
  anon_class_8_1_770d7854 untilNow;
  anon_class_4_1_6c1a4d25 validMatch;
  Data tran;
  Data *in_stack_fffffffffffffdf8;
  Data *in_stack_fffffffffffffe00;
  undefined7 in_stack_fffffffffffffe08;
  undefined1 in_stack_fffffffffffffe0f;
  anon_class_4_1_6c1a4d25 *in_stack_fffffffffffffe10;
  undefined7 in_stack_fffffffffffffe30;
  undefined7 in_stack_fffffffffffffe88;
  QTzTimeZonePrivate *in_stack_fffffffffffffe90;
  qint64 in_stack_fffffffffffffeb0;
  Data *forMSecsSinceEpoch;
  QTzTimeZonePrivate *in_stack_fffffffffffffed8;
  const_iterator local_110;
  QTzTimeZonePrivate *local_108;
  QTzTransitionTime local_98 [6];
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  QTzTransitionTime *pQStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  forMSecsSinceEpoch = in_RDI;
  pQVar3 = (QTzTimeZonePrivate *)QDateTime::currentMSecsSinceEpoch();
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_20 = (QTzTransitionTime *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  data(in_stack_fffffffffffffed8,(qint64)forMSecsSinceEpoch);
  bVar1 = data::anon_class_4_1_6c1a4d25::operator()
                    (in_stack_fffffffffffffe10,
                     (Data *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
  if (bVar1) {
    QTimeZonePrivate::Data::Data(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  }
  else {
    nextTransition(in_stack_fffffffffffffe90,CONCAT17(bVar1,in_stack_fffffffffffffe88));
    QTimeZonePrivate::Data::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    QTimeZonePrivate::Data::~Data((Data *)0x74ca89);
    bVar1 = data::anon_class_4_1_6c1a4d25::operator()
                      (in_stack_fffffffffffffe10,
                       (Data *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
    if (bVar1) {
      QTimeZonePrivate::Data::Data(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    }
    else {
      previousTransition(pQVar3,in_stack_fffffffffffffeb0);
      cVar6.i = local_98;
      QTimeZonePrivate::Data::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      QTimeZonePrivate::Data::~Data((Data *)0x74cb13);
      cVar7.i = pQStack_20;
      pQVar4 = (QTzTransitionTime *)QTimeZonePrivate::invalidMSecs();
      if (cVar7.i != pQVar4) {
        previousTransition(pQVar3,in_stack_fffffffffffffeb0);
        QTimeZonePrivate::Data::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        QTimeZonePrivate::Data::~Data((Data *)0x74cb7c);
      }
      uVar2 = data::anon_class_4_1_6c1a4d25::operator()
                        (in_stack_fffffffffffffe10,
                         (Data *)CONCAT17(in_stack_fffffffffffffe0f,in_stack_fffffffffffffe08));
      if ((bool)uVar2) {
        QTimeZonePrivate::Data::Data(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      }
      else {
        local_110.i = (QTzTransitionTime *)&DAT_aaaaaaaaaaaaaaaa;
        local_108 = pQVar3;
        tranCache(in_RSI);
        QList<QTzTransitionTime>::cbegin((QList<QTzTransitionTime> *)in_stack_fffffffffffffe00);
        pQVar5 = tranCache(in_RSI);
        QList<QTzTransitionTime>::cend((QList<QTzTransitionTime> *)in_stack_fffffffffffffe00);
        __pred.currentMSecs._7_1_ = uVar2;
        __pred.currentMSecs._0_7_ = in_stack_fffffffffffffe30;
        cVar6 = std::
                partition_point<QList<QTzTransitionTime>::const_iterator,QTzTimeZonePrivate::data(QTimeZone::TimeType)const::__1>
                          (cVar7,cVar6,__pred);
        local_110 = cVar6;
        do {
          pQVar3 = (QTzTimeZonePrivate *)tranCache(in_RSI);
          cVar7 = QList<QTzTransitionTime>::cbegin
                            ((QList<QTzTransitionTime> *)in_stack_fffffffffffffe00);
          bVar1 = QList<QTzTransitionTime>::const_iterator::operator!=(&local_110,cVar7);
          if (!bVar1) {
            QTimeZonePrivate::Data::Data(in_stack_fffffffffffffe00);
            goto LAB_0074cda3;
          }
          QList<QTzTransitionTime>::const_iterator::operator--(&local_110);
          in_stack_fffffffffffffe00 =
               (Data *)QList<QTzTransitionTime>::const_iterator::operator*(&local_110);
          tran_00._8_8_ = pQVar5;
          tran_00.atMSecsSinceEpoch = (qint64)cVar6.i;
          dataForTzTransition(pQVar3,tran_00);
          QTimeZonePrivate::Data::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
          QTimeZonePrivate::Data::~Data((Data *)0x74cd43);
        } while ((in_EDX == 1) == ((int)puStack_10 == 0));
        QTimeZonePrivate::Data::Data(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      }
    }
  }
LAB_0074cda3:
  QTimeZonePrivate::Data::~Data((Data *)0x74cdb0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QTimeZonePrivate::Data QTzTimeZonePrivate::data(QTimeZone::TimeType timeType) const
{
    // True if tran is valid and has the DST-ness to match timeType:
    const auto validMatch = [timeType](const Data &tran) {
        return tran.atMSecsSinceEpoch != invalidMSecs()
            && ((timeType == QTimeZone::DaylightTime) != (tran.daylightTimeOffset == 0));
    };

    // Get current tran, use if suitable:
    const qint64 currentMSecs = QDateTime::currentMSecsSinceEpoch();
    Data tran = data(currentMSecs);
    if (validMatch(tran))
        return tran;

    // Otherwise, next tran probably flips DST-ness:
    tran = nextTransition(currentMSecs);
    if (validMatch(tran))
        return tran;

    // Failing that, prev (or present, if current MSecs is eactly a transition
    // moment) tran defines what data() got us and the one before that probably
    // flips DST-ness:
    tran = previousTransition(currentMSecs + 1);
    if (tran.atMSecsSinceEpoch != invalidMSecs())
        tran = previousTransition(tran.atMSecsSinceEpoch);
    if (validMatch(tran))
        return tran;

    // Otherwise, we can look backwards through transitions for a match; if we
    // have a POSIX rule, it clearly doesn't do DST (or we'd have hit it by
    // now), so we only need to look in the tranCache() up to now.
    const auto untilNow = [currentMSecs](QTzTransitionTime at) {
        return at.atMSecsSinceEpoch <= currentMSecs;
    };
    auto it = std::partition_point(tranCache().cbegin(), tranCache().cend(), untilNow);
    // That's the end or first future transition; we don't want to look at it,
    // but at all those before it.
    while (it != tranCache().cbegin()) {
        --it;
        tran = dataForTzTransition(*it);
        if ((timeType == QTimeZone::DaylightTime) != (tran.daylightTimeOffset == 0))
            return tran;
    }

    return {};
}